

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_optional_asn1(CBS *cbs,CBS *out,int *out_present,CBS_ASN1_TAG tag)

{
  int iVar1;
  int iVar2;
  
  iVar1 = CBS_peek_asn1_tag(cbs,tag);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar1 = CBS_get_asn1(cbs,out,tag);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (out_present != (int *)0x0) {
    *out_present = iVar2;
  }
  return 1;
}

Assistant:

int CBS_get_optional_asn1(CBS *cbs, CBS *out, int *out_present,
                          CBS_ASN1_TAG tag) {
  int present = 0;

  if (CBS_peek_asn1_tag(cbs, tag)) {
    if (!CBS_get_asn1(cbs, out, tag)) {
      return 0;
    }
    present = 1;
  }

  if (out_present != NULL) {
    *out_present = present;
  }

  return 1;
}